

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry.cpp
# Opt level: O0

void __thiscall
SoapySDR::Registry::Registry
          (Registry *this,string *name,FindFunction *find,MakeFunction *make,string *abi)

{
  undefined1 uVar1;
  mapped_type *__lhs;
  mapped_type *__rhs;
  size_type sVar2;
  string *psVar3;
  mapped_type *this_00;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  string *in_RSI;
  string *in_RDI;
  FunctionsEntry entry;
  string *errorMsg;
  FunctionsEntry *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
  *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffea0;
  string local_130 [32];
  undefined8 local_110;
  undefined8 local_108;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  mapped_type *local_30;
  undefined8 *local_20;
  undefined8 *local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  getLoaderResults_abi_cxx11_();
  getModuleLoading_abi_cxx11_();
  __lhs = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                        *)in_stack_fffffffffffffea0,
                       (key_type *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  __rhs = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](in_stack_fffffffffffffea0,
                       (key_type *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  local_30 = __rhs;
  uVar1 = std::operator!=(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
  if ((bool)uVar1) {
    std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::__cxx11::string::operator=((string *)local_30,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
  }
  else {
    getFunctionTable_abi_cxx11_();
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
            ::count(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    if (sVar2 == 0) {
      FunctionsEntry::FunctionsEntry((FunctionsEntry *)0x173367);
      psVar3 = getModuleLoading_abi_cxx11_();
      std::__cxx11::string::operator=(local_130,(string *)psVar3);
      local_110 = *local_18;
      local_108 = *local_20;
      getFunctionTable_abi_cxx11_();
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
                              *)__rhs,(key_type *)CONCAT17(uVar1,in_stack_fffffffffffffe98));
      FunctionsEntry::operator=(this_00,in_stack_fffffffffffffe58);
      std::__cxx11::string::operator=(in_RDI,local_10);
      FunctionsEntry::~FunctionsEntry((FunctionsEntry *)0x1733fe);
    }
    else {
      std::operator+((char *)__lhs,__rhs);
      std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
      getFunctionTable_abi_cxx11_();
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
                    *)__rhs,(key_type *)CONCAT17(uVar1,in_stack_fffffffffffffe98));
      std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
      std::__cxx11::string::operator=((string *)local_30,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_100);
    }
  }
  return;
}

Assistant:

SoapySDR::Registry::Registry(const std::string &name, const FindFunction &find, const MakeFunction &make, const std::string &abi)
{
    //create an entry for the loader result
    std::string &errorMsg = getLoaderResults()[getModuleLoading()][name];

    //abi check
    if (abi != SOAPY_SDR_ABI_VERSION)
    {
        errorMsg = name + " failed ABI check: Library ABI=" SOAPY_SDR_ABI_VERSION ", Module ABI="+abi;
        return;
    }

    //duplicate check
    if (getFunctionTable().count(name) != 0)
    {
        errorMsg = "duplicate entry for " + name + " ("+getFunctionTable()[name].modulePath + ")";
        return;
    }

    //register functions
    FunctionsEntry entry;
    entry.modulePath = getModuleLoading();
    entry.find = find;
    entry.make = make;
    getFunctionTable()[name] = entry;
    _name = name;
}